

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

void examine_object(obj *obj)

{
  byte *pbVar1;
  
  if ((objects[obj->otyp].field_0x10 & 0x45) == 0x44) {
    obj->field_0x4a = obj->field_0x4a & 0xef;
  }
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    obj->field_0x4a = obj->field_0x4a | 0x20;
  }
  if (urole.malenum == 0x161) {
    obj->field_0x4a = obj->field_0x4a | 0x40;
  }
  if ((obj->oprops & 0xfffff) != 0) {
    pbVar1 = (byte *)((long)&obj->oprops_known + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

void examine_object(struct obj *obj)
{
	int typ = obj->otyp;
	struct objclass *ocl = &objects[typ];
	int nn = ocl->oc_name_known;
	
	/* clean up known when it's tied to oc_name_known, eg after AD_DRIN */
	if (!nn && ocl->oc_uses_known && ocl->oc_unique) obj->known = 0;
	if (!Blind) obj->dknown = TRUE;
	if (Role_if (PM_PRIEST)) obj->bknown = TRUE;

	/* everybody can sense these for now, otherwise these will be
	 * ignored like +5 armor hidden amongst tons of +0 junk */
	if (obj->oprops & ITEM_PROP_MASK)
	    obj->oprops_known |= ITEM_MAGICAL;
}